

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxInWitness(void *handle,int net_type,char *tx_hex_string,uint32_t txin_index,
                     uint32_t stack_index,char **stack_data)

{
  bool bVar1;
  undefined8 uVar2;
  size_type sVar3;
  reference this;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this_00;
  uint32_t in_ECX;
  string *in_RDX;
  uint in_R8D;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  ConfidentialTxInReference ref_1;
  ConfidentialTransactionContext tx_1;
  TxInReference ref;
  TransactionContext tx;
  bool is_bitcoin;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  AbstractTxInReference *in_stack_fffffffffffff9f8;
  ConfidentialTxInReference *in_stack_fffffffffffffa00;
  string *in_stack_fffffffffffffa10;
  undefined8 in_stack_fffffffffffffa18;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffa20;
  CfdException *this_01;
  ConfidentialTransactionContext *this_02;
  bool *in_stack_fffffffffffffa58;
  string *in_stack_fffffffffffffa60;
  allocator *paVar4;
  string local_580;
  undefined1 local_55a;
  undefined1 local_559 [33];
  CfdSourceLocation local_538;
  ScriptWitness local_520;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_500;
  ConfidentialTxInReference local_4e8;
  undefined1 local_381 [33];
  ConfidentialTransaction local_360 [3];
  ScriptWitness local_288;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_268;
  TxInReference local_250;
  allocator local_1b9;
  string local_1b8 [32];
  Transaction local_198 [2];
  byte local_d9;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined8 *local_30;
  uint local_28;
  uint32_t local_24;
  string *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa18 >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0xa09;
    local_58.funcname = "CfdGetTxInWitness";
    cfd::core::logger::warn<>(&local_58,"tx is null or empty.");
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Failed to parameter. tx is null or empty.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffa20,error_code,in_stack_fffffffffffffa10);
    local_7a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_30 == (undefined8 *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0xa0f;
    local_98.funcname = "CfdGetTxInWitness";
    cfd::core::logger::warn<>(&local_98,"stack data is null.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. stack data is null.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffa20,error_code,in_stack_fffffffffffffa10);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&local_d8);
  local_d9 = 0;
  cfd::capi::ConvertNetType
            ((int)((ulong)in_stack_fffffffffffffa60 >> 0x20),in_stack_fffffffffffffa58);
  if ((local_d9 & 1) == 0) {
    this_02 = (ConfidentialTransactionContext *)local_381;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_381 + 1),(char *)local_20,(allocator *)this_02);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(this_02,local_20);
    std::__cxx11::string::~string((string *)(local_381 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_381);
    cfd::core::ConfidentialTransaction::GetTxIn(&local_4e8,local_360,local_24);
    cfd::core::AbstractTxInReference::GetScriptWitness(in_stack_fffffffffffff9f8);
    cfd::core::ScriptWitness::GetWitness(&local_500,&local_520);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&local_d8,&local_500);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_fffffffffffffa10);
    cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x656293);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffa00);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)in_stack_fffffffffffffa00);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,(char *)local_20,&local_1b9);
    cfd::TransactionContext::TransactionContext
              ((TransactionContext *)in_stack_fffffffffffffa00,(string *)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    cfd::core::Transaction::GetTxIn(&local_250,local_198,local_24);
    cfd::core::AbstractTxInReference::GetScriptWitness(in_stack_fffffffffffff9f8);
    cfd::core::ScriptWitness::GetWitness(&local_268,&local_288);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&local_d8,&local_268);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_fffffffffffffa10);
    cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x65609d);
    cfd::core::TxInReference::~TxInReference((TxInReference *)0x6560aa);
    cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_fffffffffffffa00);
  }
  sVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_d8);
  if (sVar3 <= local_28) {
    local_538.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_538.filename = local_538.filename + 1;
    local_538.line = 0xa28;
    local_538.funcname = "CfdGetTxInWitness";
    cfd::core::logger::warn<>(&local_538,"stackIndex is illegal.");
    local_55a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    this_01 = (CfdException *)local_559;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_559 + 1),"Failed to parameter. stackIndex out of witness stack.",
               (allocator *)this_01);
    cfd::core::CfdException::CfdException
              (this_01,(CfdError)((ulong)uVar2 >> 0x20),in_stack_fffffffffffffa10);
    local_55a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                   (&local_d8,(ulong)local_28);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_580,this);
  this_00 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
            cfd::capi::CreateString(in_stack_fffffffffffffa60);
  *local_30 = this_00;
  std::__cxx11::string::~string((string *)&local_580);
  local_4 = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(this_00);
  return local_4;
}

Assistant:

int CfdGetTxInWitness(
    void* handle, int net_type, const char* tx_hex_string, uint32_t txin_index,
    uint32_t stack_index, char** stack_data) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (stack_data == nullptr) {
      warn(CFD_LOG_SOURCE, "stack data is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack data is null.");
    }

    std::vector<ByteData> witness_stack;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxInReference ref = tx.GetTxIn(txin_index);
      witness_stack = ref.GetScriptWitness().GetWitness();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxInReference ref = tx.GetTxIn(txin_index);
      witness_stack = ref.GetScriptWitness().GetWitness();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (witness_stack.size() <= stack_index) {
      warn(CFD_LOG_SOURCE, "stackIndex is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. stackIndex out of witness stack.");
    }
    *stack_data = CreateString(witness_stack[stack_index].GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}